

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O3

date_t duckdb::DateTrunc::
       UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::SecondOperator>(date_t input)

{
  duckdb *this;
  bool bVar1;
  undefined1 auVar2 [12];
  date_t result;
  date_t local_3c;
  string local_38;
  
  this = (duckdb *)(ulong)(uint)input.days;
  bVar1 = Value::IsFinite<duckdb::date_t>(input);
  if ((!bVar1) &&
     (bVar1 = TryCast::Operation<duckdb::date_t,duckdb::date_t>(input,&local_3c,false),
     input.days = local_3c.days, !bVar1)) {
    auVar2 = __cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::date_t,duckdb::date_t>(&local_38,this,(date_t)auVar2._8_4_);
    InvalidInputException::InvalidInputException(auVar2._0_8_,&local_38);
    __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return (date_t)input.days;
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}